

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

int re_compile_and_match
              (re_context *ctx,char *pattern,size_t patlen,char *searchstr,size_t searchlen)

{
  re_status_t rVar1;
  int iVar2;
  re_machine machine;
  re_machine local_20;
  
  rVar1 = re_compile(ctx,pattern,patlen,&local_20);
  iVar2 = 0;
  if (rVar1 == RE_STATUS_SUCCESS) {
    re_save_search_str(ctx,searchstr,searchlen);
    memset(ctx->regs,0,0xa0);
    iVar2 = re_match((re_pattern_buffer *)ctx,ctx->strbuf,(int)ctx->strbuf,(int)ctx->curlen,
                     (re_registers *)&local_20);
  }
  return iVar2;
}

Assistant:

int re_compile_and_match(re_context *ctx,
                         const char *pattern, size_t patlen,
                         const char *searchstr, size_t searchlen)
{
    re_machine machine;

    /* compile the expression - return failure if we get an error */
    if (re_compile(ctx, pattern, patlen, &machine) != RE_STATUS_SUCCESS)
        return FALSE;

    /* save the search string in our internal buffer */
    re_save_search_str(ctx, searchstr, searchlen);

    /* clear the group registers */
    memset(ctx->regs, 0, sizeof(ctx->regs));

    /* match the string */
    return re_match(ctx, ctx->strbuf, ctx->strbuf, ctx->curlen,
                    &machine, ctx->regs);
}